

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZVec<int> *blocksizes,
          TPZFMatrix<std::complex<double>_> *glob)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  complex<double> *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t newsize;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  long local_88;
  complex<double> local_48;
  
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBlockDiagonal_01858160;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  (this->fStorage).fStore = (complex<double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  (this->fBlockPos)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fBlockPos).fStore = (long *)0x0;
  (this->fBlockPos).fNElements = 0;
  (this->fBlockPos).fNAlloc = 0;
  TPZVec<int>::TPZVec(&this->fBlockSize,blocksizes);
  lVar2 = blocksizes->fNElements;
  local_48._M_value._0_8_ = 0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar2 + 1,(long *)&local_48);
  if (lVar2 < 1) {
    newsize = 0;
    lVar7 = 0;
  }
  else {
    piVar3 = blocksizes->fStore;
    plVar4 = (this->fBlockPos).fStore;
    lVar6 = *plVar4;
    lVar9 = 0;
    lVar7 = 0;
    newsize = 0;
    do {
      iVar1 = piVar3[lVar9];
      lVar7 = lVar7 + iVar1;
      lVar6 = lVar6 + (ulong)(uint)(iVar1 * iVar1);
      plVar4[lVar9 + 1] = lVar6;
      lVar9 = lVar9 + 1;
      newsize = newsize + (ulong)(uint)(iVar1 * iVar1);
    } while (lVar2 != lVar9);
  }
  local_48._M_value._0_8_ = 0;
  local_48._M_value._8_8_ = 0;
  TPZVec<std::complex<double>_>::Resize(&this->fStorage,newsize,&local_48);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = lVar7;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = lVar7;
  if (0 < lVar2) {
    local_88 = 0;
    lVar7 = 0;
    do {
      lVar6 = (long)(this->fBlockSize).fStore[lVar7];
      if (0 < lVar6) {
        uVar11 = (this->fBlockPos).fStore[lVar7] << 4 | 8;
        lVar9 = 0;
        do {
          lVar8 = local_88;
          lVar10 = lVar6;
          uVar12 = uVar11;
          do {
            (*(glob->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(glob,lVar9 + local_88,lVar8);
            pcVar5 = (this->fStorage).fStore;
            *(ulong *)(pcVar5->_M_value + (uVar12 - 8)) =
                 CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            *(undefined8 *)(pcVar5->_M_value + uVar12) = in_XMM1_Qa;
            uVar12 = uVar12 + lVar6 * 0x10;
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          lVar9 = lVar9 + 1;
          uVar11 = uVar11 + 0x10;
        } while (lVar9 != lVar6);
      }
      local_88 = local_88 + lVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar2);
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}